

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrGetInputSourceLocalizedName
                   (XrSession session,XrInputSourceLocalizedNameGetInfo *getInfo,
                   uint32_t bufferCapacityInput,uint32_t *bufferCountOutput,char *buffer)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  XrSession_T *in_stack_fffffffffffffd58;
  string local_2a0;
  string local_280;
  XrSession session_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_238;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_218;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_200;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b8;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 2;
  session_local = session;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&session_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSessionHandle(&session_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session_local);
    instance_info = pVar3.second;
    if (getInfo == (XrInputSourceLocalizedNameGetInfo *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrGetInputSourceLocalizedName-getInfo-parameter",
                 (allocator *)&local_238);
      std::__cxx11::string::string
                ((string *)&local_2a0,"xrGetInputSourceLocalizedName",
                 (allocator *)&stack0xfffffffffffffd5f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_280,
                 "Invalid NULL for XrInputSourceLocalizedNameGetInfo \"getInfo\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd5e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2a0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1d0,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      this = &local_1d0;
    }
    else {
      std::__cxx11::string::string
                ((string *)&oss,"xrGetInputSourceLocalizedName",(allocator *)&local_2a0);
      XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,true,true,getInfo);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar2 == XR_SUCCESS) {
        if (buffer == (char *)0x0 && bufferCapacityInput != 0) {
          std::__cxx11::string::string
                    ((string *)&oss,"VUID-xrGetInputSourceLocalizedName-buffer-parameter",
                     (allocator *)&local_238);
          std::__cxx11::string::string
                    ((string *)&local_2a0,"xrGetInputSourceLocalizedName",
                     (allocator *)&stack0xfffffffffffffd5f);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_200,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_280,
                     "Command xrGetInputSourceLocalizedName param buffer is NULL, but bufferCapacityInput is greater than 0"
                     ,(allocator *)&stack0xfffffffffffffd5e);
          CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              &local_2a0,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_200,&local_280);
          std::__cxx11::string::~string((string *)&local_280);
          this = &local_200;
        }
        else {
          XVar2 = XR_SUCCESS;
          if (bufferCountOutput != (uint32_t *)0x0) goto LAB_001cc608;
          std::__cxx11::string::string
                    ((string *)&oss,"VUID-xrGetInputSourceLocalizedName-bufferCountOutput-parameter"
                     ,(allocator *)&local_238);
          std::__cxx11::string::string
                    ((string *)&local_2a0,"xrGetInputSourceLocalizedName",
                     (allocator *)&stack0xfffffffffffffd5f);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_218,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_280,
                     "Invalid NULL for uint32_t \"bufferCountOutput\" which is not optional and must be non-NULL"
                     ,(allocator *)&stack0xfffffffffffffd5e);
          CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              &local_2a0,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_218,&local_280);
          std::__cxx11::string::~string((string *)&local_280);
          this = &local_218;
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrGetInputSourceLocalizedName-getInfo-parameter",
                   (allocator *)&local_238);
        std::__cxx11::string::string
                  ((string *)&local_2a0,"xrGetInputSourceLocalizedName",
                   (allocator *)&stack0xfffffffffffffd5f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1e8,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_280,
                   "Command xrGetInputSourceLocalizedName param getInfo is invalid",
                   (allocator *)&stack0xfffffffffffffd5e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2a0
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1e8,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        this = &local_1e8;
      }
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&oss);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(in_stack_fffffffffffffd58);
    std::operator<<((ostream *)&oss,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::string
              ((string *)&local_2a0,"VUID-xrGetInputSourceLocalizedName-session-parameter",
               (allocator *)&stack0xfffffffffffffd5f);
    std::__cxx11::string::string
              ((string *)&local_280,"xrGetInputSourceLocalizedName",
               (allocator *)&stack0xfffffffffffffd5e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2a0,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b8,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b8);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
LAB_001cc608:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrGetInputSourceLocalizedName(
XrSession session,
const XrInputSourceLocalizedNameGetInfo* getInfo,
uint32_t bufferCapacityInput,
uint32_t* bufferCountOutput,
char* buffer) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrGetInputSourceLocalizedName-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetInputSourceLocalizedName",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == getInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetInputSourceLocalizedName-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetInputSourceLocalizedName", objects_info,
                                "Invalid NULL for XrInputSourceLocalizedNameGetInfo \"getInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrInputSourceLocalizedNameGetInfo is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetInputSourceLocalizedName", objects_info,
                                                        true, true, getInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetInputSourceLocalizedName-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetInputSourceLocalizedName",
                                objects_info,
                                "Command xrGetInputSourceLocalizedName param getInfo is invalid");
            return xr_result;
        }
        // Optional array must be non-NULL when bufferCapacityInput is non-zero
        if (0 != bufferCapacityInput && nullptr == buffer) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetInputSourceLocalizedName-buffer-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetInputSourceLocalizedName",
                                objects_info,
                                "Command xrGetInputSourceLocalizedName param buffer is NULL, but bufferCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == bufferCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetInputSourceLocalizedName-bufferCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetInputSourceLocalizedName", objects_info,
                                "Invalid NULL for uint32_t \"bufferCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrGetInputSourceLocalizedName-bufferCountOutput-parameter" type
        // NOTE: Can't validate "VUID-xrGetInputSourceLocalizedName-buffer-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}